

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int bc_get_leb128(BCReaderState *s,uint32_t *pval)

{
  int iVar1;
  uint32_t *in_RSI;
  long in_RDI;
  int ret;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  iVar1 = get_leb128(in_RSI,*(uint8_t **)(in_RDI + 0x10),*(uint8_t **)(in_RDI + 0x18));
  if (iVar1 < 0) {
    local_4 = bc_read_error_end((BCReaderState *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
  }
  else {
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + (long)iVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int bc_get_leb128(BCReaderState *s, uint32_t *pval)
{
    int ret;
    ret = get_leb128(pval, s->ptr, s->buf_end);
    if (unlikely(ret < 0))
        return bc_read_error_end(s);
    s->ptr += ret;
    return 0;
}